

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

void __thiscall
gl4cts::GLSL420Pack::BindingSamplerSingleTest::prepareUniforms
          (BindingSamplerSingleTest *this,program *program)

{
  texture *this_00;
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  socklen_t __len;
  ulong uVar2;
  sockaddr *__addr;
  vector<unsigned_int,_std::allocator<unsigned_int>_> texture_data;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  
  this_00 = &this->m_goku_texture;
  Utils::texture::create(this_00,0x10,0x10,0x8058);
  local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&local_28,0x100);
  if ((long)local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    uVar2 = 0;
    do {
      local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar2] = 0xff;
      uVar2 = uVar2 + 1;
    } while ((uVar2 & 0xffffffff) <
             (ulong)((long)local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  Utils::texture::update
            (this_00,0x10,0x10,0,0x1908,0x1401,
             local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  iVar1 = (*((this->super_GLSLTestBase).super_TestBase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 8))(0x84c2);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  iVar1 = 0x1ab5f16;
  __len = 0x2913;
  glu::checkError(err,"ActiveTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x2913);
  Utils::texture::bind(this_00,iVar1,__addr,__len);
  if (local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BindingSamplerSingleTest::prepareUniforms(Utils::program& program)
{
	(void)program;
	static const GLuint goku_data = 0x000000ff;

	m_goku_texture.create(16, 16, GL_RGBA8);

	std::vector<GLuint> texture_data;
	texture_data.resize(16 * 16);

	for (GLuint i = 0; i < texture_data.size(); ++i)
	{
		texture_data[i] = goku_data;
	}

	m_goku_texture.update(16, 16, 0 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, &texture_data[0]);

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.activeTexture(GL_TEXTURE2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "ActiveTexture");

	m_goku_texture.bind();
}